

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall slang::parsing::Lexer::scanBlockComment(Lexer *this)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int unused2;
  uint32_t unused1;
  char *local_28;
  
  bVar3 = tryApplyCommentHandler(this);
  if (bVar3) {
    addTrivia(this,DisabledText);
    return;
  }
  bVar3 = false;
  do {
    pcVar2 = this->sourceBuffer;
    cVar1 = *pcVar2;
    if (cVar1 < '\0') {
      bVar4 = scanUTF8Char(this,bVar3,&unused1,&unused2);
      bVar3 = (bool)(bVar3 | !bVar4);
      bVar4 = true;
    }
    else {
      if (cVar1 == '\0') {
        if (pcVar2 < this->sourceEnd + -1) {
          this->errorCount = this->errorCount + 1;
          Diagnostics::add(this->diagnostics,(DiagCode)0x50002,
                           (SourceLocation)
                           (((long)pcVar2 - (long)this->originalBegin) * 0x10000000 |
                           (ulong)((this->bufferId).id & 0xfffffff)));
          this->sourceBuffer = this->sourceBuffer + 1;
          goto LAB_0014cd9b;
        }
        Diagnostics::add(this->diagnostics,(DiagCode)0x120002,
                         (SourceLocation)
                         (((long)pcVar2 - (long)this->originalBegin) * 0x10000000 |
                         (ulong)((this->bufferId).id & 0xfffffff)));
LAB_0014cdc0:
        bVar4 = false;
      }
      else {
        if (cVar1 == '/') {
          if (pcVar2[1] == '*') {
            Diagnostics::add(this->diagnostics,(DiagCode)0xb0002,
                             (SourceLocation)
                             (((long)pcVar2 - (long)this->originalBegin) * 0x10000000 |
                             (ulong)((this->bufferId).id & 0xfffffff)));
            this->sourceBuffer = this->sourceBuffer + 2;
            goto LAB_0014cd9b;
          }
        }
        else if ((cVar1 == '*') && (pcVar2[1] == '/')) {
          this->sourceBuffer = pcVar2 + 2;
          goto LAB_0014cdc0;
        }
        this->sourceBuffer = pcVar2 + 1;
LAB_0014cd9b:
        bVar4 = true;
      }
      bVar3 = false;
    }
    if (!bVar4) {
      unused2._0_1_ = 4;
      local_28 = this->marker;
      _unused1 = (ulong)(uint)(*(int *)&this->sourceBuffer - (int)local_28);
      SmallVectorBase<slang::parsing::Trivia>::
      emplace_back<slang::parsing::TriviaKind&,std::basic_string_view<char,std::char_traits<char>>>
                (&(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>,
                 (TriviaKind *)&unused2,(basic_string_view<char,_std::char_traits<char>_> *)&unused1
                );
      return;
    }
  } while( true );
}

Assistant:

void Lexer::scanBlockComment() {
    if (tryApplyCommentHandler()) [[unlikely]] {
        addTrivia(TriviaKind::DisabledText);
        return;
    }

    bool sawUTF8Error = false;
    while (true) {
        char c = peek();
        if (isASCII(c)) {
            sawUTF8Error = false;
            if (c == '*' && peek(1) == '/') {
                advance(2);
                break;
            }
            else if (c == '/' && peek(1) == '*') {
                // nested block comments disallowed by the standard; ignore and continue
                addDiag(diag::NestedBlockComment, currentOffset());
                advance(2);
            }
            else if (c == '\0') {
                if (reallyAtEnd()) {
                    addDiag(diag::UnterminatedBlockComment, currentOffset());
                    break;
                }

                // otherwise just error and ignore
                errorCount++;
                addDiag(diag::EmbeddedNull, currentOffset());
                advance();
            }
            else {
                advance();
            }
        }
        else {
            sawUTF8Error |= !scanUTF8Char(sawUTF8Error);
        }
    }

    addTrivia(TriviaKind::BlockComment);
}